

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O0

string * __thiscall
sentencepiece::normalizer::Normalizer::Normalize_abi_cxx11_(Normalizer *this,string_view input)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  string *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  string *normalized;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  Status local_48;
  undefined1 local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  undefined8 local_18;
  undefined8 uStack_10;
  
  this_00 = &local_38;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x475fa3);
  local_39 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  (**(code **)(*in_RSI + 0x20))(&local_48,in_RSI,local_18,uStack_10,in_RDI,this_00);
  util::Status::IgnoreError(&local_48);
  util::Status::~Status((Status *)0x475ffb);
  local_39 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

std::string Normalizer::Normalize(absl::string_view input) const {
  std::vector<size_t> norm_to_orig;
  std::string normalized;
  Normalize(input, &normalized, &norm_to_orig).IgnoreError();
  return normalized;
}